

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InvalidStatement * __thiscall
slang::BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
          (BumpAllocator *this,Statement **args)

{
  InvalidStatement *pIVar1;
  Statement *in_RDI;
  InvalidStatement *unaff_retaddr;
  
  pIVar1 = (InvalidStatement *)allocate((BumpAllocator *)args,(size_t)unaff_retaddr,(size_t)in_RDI);
  ast::InvalidStatement::InvalidStatement(unaff_retaddr,in_RDI);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }